

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::toString(QString *__return_storage_ptr__,QLocale *this,double f,char format,int precision)

{
  uint uVar1;
  QLocalePrivate *pQVar2;
  char cVar3;
  DoubleForm form;
  undefined7 in_register_00000011;
  bool bVar4;
  
  bVar4 = (int)CONCAT71(in_register_00000011,format) - 0x41U < 0x1a;
  cVar3 = format + ' ';
  if (!bVar4) {
    cVar3 = format;
  }
  form = DFSignificantDigits;
  if (cVar3 != 'g') {
    form = (uint)(cVar3 != 'e');
  }
  pQVar2 = (this->d).d.ptr;
  uVar1 = (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
          super_QFlagsStorage<QLocale::NumberOption>.i;
  QLocaleData::doubleToString
            (__return_storage_ptr__,pQVar2->m_data,f,precision,form,-1,
             (uVar1 >> 4 & 1 | (uVar1 & 4) << 7 | (uVar1 & 1) << 5 | (uint)bVar4 << 6) ^ 0x220);
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::toString(double f, char format, int precision) const
{
    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    uint flags = isAsciiUpper(format) ? QLocaleData::CapitalEorX : 0;

    switch (QtMiscUtils::toAsciiLower(format)) {
    case 'f':
        form = QLocaleData::DFDecimal;
        break;
    case 'e':
        form = QLocaleData::DFExponent;
        break;
    case 'g':
        form = QLocaleData::DFSignificantDigits;
        break;
    default:
        break;
    }

    if (!(d->m_numberOptions & OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;
    if (!(d->m_numberOptions & OmitLeadingZeroInExponent))
        flags |= QLocaleData::ZeroPadExponent;
    if (d->m_numberOptions & IncludeTrailingZeroesAfterDot)
        flags |= QLocaleData::AddTrailingZeroes;
    return d->m_data->doubleToString(f, precision, form, -1, flags);
}